

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O1

int write_nal_unit(h264_stream_t *h,uint8_t *buf,int size)

{
  char cVar1;
  uint uVar2;
  nal_t *pnVar3;
  byte *pbVar4;
  int iVar5;
  byte *rbsp_buf;
  bs_t *b;
  int iVar6;
  uint uVar7;
  long lVar8;
  bool bVar9;
  int rbsp_size;
  int nal_size;
  int local_40;
  int local_3c;
  uint8_t *local_38;
  
  pnVar3 = h->nal;
  local_40 = size;
  local_3c = size;
  local_38 = buf;
  rbsp_buf = (byte *)calloc(1,(long)size);
  local_40 = size * 3 + 3;
  if (-1 < size * 3) {
    local_40 = size * 3;
  }
  local_40 = local_40 >> 2;
  lVar8 = (long)local_40;
  b = (bs_t *)malloc(0x20);
  b->start = rbsp_buf;
  b->p = rbsp_buf;
  b->end = rbsp_buf + lVar8;
  b->bits_left = 7;
  if (1 < size) {
    *rbsp_buf = *rbsp_buf & 0x7f;
  }
  if (b->bits_left == 0) {
    b->p = b->p + 1;
    b->bits_left = 8;
  }
  uVar2 = pnVar3->nal_ref_idc;
  uVar7 = 1;
  do {
    iVar6 = b->bits_left + -1;
    b->bits_left = iVar6;
    pbVar4 = b->p;
    if (pbVar4 < b->end) {
      *pbVar4 = *pbVar4 & ~(byte)(1 << ((byte)iVar6 & 0x1f));
      *b->p = *b->p | ((uVar2 >> (uVar7 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar9 = uVar7 != 0;
    uVar7 = uVar7 - 1;
  } while (bVar9);
  uVar2 = pnVar3->nal_unit_type;
  uVar7 = 4;
  do {
    iVar6 = b->bits_left + -1;
    b->bits_left = iVar6;
    pbVar4 = b->p;
    if (pbVar4 < b->end) {
      *pbVar4 = *pbVar4 & ~(byte)(1 << ((byte)iVar6 & 0x1f));
      *b->p = *b->p | ((uVar2 >> (uVar7 & 0x1f) & 1) != 0) << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    bVar9 = uVar7 != 0;
    uVar7 = uVar7 - 1;
  } while (bVar9);
  iVar6 = pnVar3->nal_unit_type;
  if (iVar6 == 0xe) {
LAB_0012be4c:
    cVar1 = pnVar3->svc_extension_flag;
LAB_0012be56:
    iVar6 = b->bits_left + -1;
    b->bits_left = iVar6;
    pbVar4 = b->p;
    if (pbVar4 < b->end) {
      *pbVar4 = *pbVar4 & ~(byte)(1 << ((byte)iVar6 & 0x1f));
      *b->p = *b->p | cVar1 << ((byte)b->bits_left & 0x1f);
    }
    if (b->bits_left == 0) {
      b->p = b->p + 1;
      b->bits_left = 8;
    }
    if (pnVar3->svc_extension_flag == true) {
      write_nal_unit_header_svc_extension(pnVar3->nal_svc_ext,b);
    }
  }
  else {
    if (iVar6 == 0x15) {
      cVar1 = pnVar3->avc_3d_extension_flag;
      goto LAB_0012be56;
    }
    if (iVar6 == 0x14) goto LAB_0012be4c;
  }
  iVar6 = -1;
  switch(pnVar3->nal_unit_type) {
  case 1:
  case 5:
  case 0x13:
  case 0x14:
    write_slice_layer_rbsp(h,b);
    goto LAB_0012bf2a;
  default:
    goto switchD_0012bec9_caseD_2;
  case 7:
    write_seq_parameter_set_rbsp(h->sps,b);
    break;
  case 8:
    write_pic_parameter_set_rbsp(h,b);
    break;
  case 9:
    write_access_unit_delimiter_rbsp(h,b);
    break;
  case 10:
  case 0xb:
    break;
  case 0xe:
    if (h->nal->svc_extension_flag == true) {
      write_prefix_nal_unit_svc(h->nal,b);
    }
    break;
  case 0xf:
    write_subset_seq_parameter_set_rbsp(h->sps_subset,b);
  }
  write_rbsp_trailing_bits(b);
LAB_0012bf2a:
  if (b->end < b->p) {
    free(b);
    free(rbsp_buf);
  }
  else {
    local_40 = (int)b->p - *(int *)&b->start;
    iVar5 = rbsp_to_nal(rbsp_buf,&local_40,local_38,&local_3c);
    free(b);
    free(rbsp_buf);
    iVar6 = -1;
    if (-1 < iVar5) {
      iVar6 = local_3c;
    }
  }
switchD_0012bec9_caseD_2:
  return iVar6;
}

Assistant:

int write_nal_unit(h264_stream_t* h, uint8_t* buf, int size)
{
    nal_t* nal = h->nal;

    int nal_size = size;
    int rbsp_size = size;
    uint8_t* rbsp_buf = (uint8_t*)calloc(1, rbsp_size);

    if( 0 )
    {
        int rc = nal_to_rbsp(buf, &nal_size, rbsp_buf, &rbsp_size);

        if (rc < 0) { free(rbsp_buf); return -1; } // handle conversion error
    }

    if( 1 )
    {
        rbsp_size = size*3/4; // NOTE this may have to be slightly smaller (3/4 smaller, worst case) in order to be guaranteed to fit
    }

    bs_t* b = bs_new(rbsp_buf, rbsp_size);
    /* forbidden_zero_bit */ bs_write_u(b, 1, 0);
    bs_write_u(b, 2, nal->nal_ref_idc);
    bs_write_u(b, 5, nal->nal_unit_type);
    
    if( nal->nal_unit_type == 14 || nal->nal_unit_type == 21 || nal->nal_unit_type == 20 )
    {
        if( nal->nal_unit_type != 21 )
        {
            bs_write_u1(b, nal->svc_extension_flag);
        }
        else
        {
            bs_write_u1(b, nal->avc_3d_extension_flag);
        }
        
        if( nal->svc_extension_flag )
        {
            write_nal_unit_header_svc_extension(nal->nal_svc_ext, b);
        }
    }

    switch ( nal->nal_unit_type )
    {
        case NAL_UNIT_TYPE_CODED_SLICE_IDR:
        case NAL_UNIT_TYPE_CODED_SLICE_NON_IDR:  
        case NAL_UNIT_TYPE_CODED_SLICE_AUX:
            write_slice_layer_rbsp(h, b);
            break;

#ifdef HAVE_SEI
        case NAL_UNIT_TYPE_SEI:
            write_sei_rbsp(h, b);
            write_rbsp_trailing_bits(b);
            break;
#endif

        case NAL_UNIT_TYPE_SPS: 
            write_seq_parameter_set_rbsp(h->sps, b);
            write_rbsp_trailing_bits(b);
            
            if( 0 )
            {
                memcpy(h->sps_table[h->sps->seq_parameter_set_id], h->sps, sizeof(sps_t));
            }

            break;

        case NAL_UNIT_TYPE_PPS:   
            write_pic_parameter_set_rbsp(h, b);
            write_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_AUD:     
            write_access_unit_delimiter_rbsp(h, b); 
            write_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_END_OF_SEQUENCE: 
            write_end_of_seq_rbsp(h, b);
            write_rbsp_trailing_bits(b);
            break;

        case NAL_UNIT_TYPE_END_OF_STREAM: 
            write_end_of_stream_rbsp(h, b);
            write_rbsp_trailing_bits(b);
            break;

        //SVC support
        case NAL_UNIT_TYPE_SUBSET_SPS:
            write_subset_seq_parameter_set_rbsp(h->sps_subset, b);
            write_rbsp_trailing_bits(b);
            
            if( 0 )
            {
                memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id], h->sps_subset, sizeof(sps_subset_t));
                //memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->sps, h->sps_subset->sps, sizeof(sps_t));
                //memcpy(h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->sps_svc_ext, h->sps_subset->sps_svc_ext, sizeof(sps_svc_ext_t));
                //h->sps_subset_table[h->sps_subset->sps->seq_parameter_set_id]->additional_extension2_flag = h->sps_subset->additional_extension2_flag;
            }

            break;
            
        //prefix NAL
        case NAL_UNIT_TYPE_PREFIX_NAL:
            write_prefix_nal_unit_rbsp(h->nal, b);
            write_rbsp_trailing_bits(b);
            break;
            
        //SVC support
        case NAL_UNIT_TYPE_CODED_SLICE_SVC_EXTENSION:            
            write_slice_layer_rbsp(h, b);
            
            break;
            
        case NAL_UNIT_TYPE_FILLER:
        case NAL_UNIT_TYPE_SPS_EXT:
        case NAL_UNIT_TYPE_UNSPECIFIED:
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_A:  
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_B: 
        case NAL_UNIT_TYPE_CODED_SLICE_DATA_PARTITION_C:
        default:
            return -1;
    }

    if (bs_overrun(b)) { bs_free(b); free(rbsp_buf); return -1; }

    if( 1 )
    {
        // now get the actual size used
        rbsp_size = bs_pos(b);

        int rc = rbsp_to_nal(rbsp_buf, &rbsp_size, buf, &nal_size);
        if (rc < 0) { bs_free(b); free(rbsp_buf); return -1; }
    }

    bs_free(b);
    free(rbsp_buf);

    return nal_size;
}